

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataCollection::StructWithinCollectionComputeHeapSizes
               (Vector *heap_sizes_v,Vector *source_v,TupleDataVectorFormat *source_format,
               SelectionVector *append_sel,idx_t append_count,UnifiedVectorFormat *list_data)

{
  SelectionVector *pSVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference this_00;
  type source_v_00;
  reference source_format_00;
  idx_t iVar7;
  idx_t iVar8;
  size_type __n;
  SelectionVector list_sel;
  shared_ptr<duckdb::SelectionData,_true> local_40;
  
  pSVar1 = list_data->sel;
  local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&local_40,&pSVar1->selection_data);
  psVar2 = pSVar1->sel_vector;
  if (append_count != 0) {
    pdVar3 = list_data->data;
    pdVar4 = heap_sizes_v->data;
    psVar5 = append_sel->sel_vector;
    puVar6 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar7 = 0;
    do {
      iVar8 = iVar7;
      if (psVar5 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar5[iVar7];
      }
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      if (((puVar6 == (unsigned_long *)0x0) || ((puVar6[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) &&
         (*(long *)(pdVar3 + iVar8 * 0x10 + 8) != 0)) {
        *(ulong *)(pdVar4 + iVar7 * 8) =
             *(long *)(pdVar4 + iVar7 * 8) + (*(long *)(pdVar3 + iVar8 * 0x10 + 8) + 7U >> 3);
      }
      iVar7 = iVar7 + 1;
    } while (append_count != iVar7);
  }
  this = StructVector::GetEntries(source_v);
  if ((this->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this,__n);
      source_v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_00);
      source_format_00 =
           vector<duckdb::TupleDataVectorFormat,_true>::operator[](&source_format->children,__n);
      WithinCollectionComputeHeapSizes
                (heap_sizes_v,source_v_00,source_format_00,append_sel,append_count,list_data);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_40.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void TupleDataCollection::StructWithinCollectionComputeHeapSizes(Vector &heap_sizes_v, const Vector &source_v,
                                                                 TupleDataVectorFormat &source_format,
                                                                 const SelectionVector &append_sel,
                                                                 const idx_t append_count,
                                                                 const UnifiedVectorFormat &list_data) {
	// Parent list data
	const auto list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Target
	auto heap_sizes = FlatVector::GetData<idx_t>(heap_sizes_v);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list length
		const auto &list_length = list_entries[list_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Size is just the validity mask
		heap_sizes[i] += ValidityBytes::SizeInBytes(list_length);
	}

	// Recurse
	auto &struct_sources = StructVector::GetEntries(source_v);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
		auto &struct_source = *struct_sources[struct_col_idx];

		auto &struct_format = source_format.children[struct_col_idx];
		WithinCollectionComputeHeapSizes(heap_sizes_v, struct_source, struct_format, append_sel, append_count,
		                                 list_data);
	}
}